

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrRasterizer.cpp
# Opt level: O2

bool rr::LineRasterUtil::vertexOnLeftSideOfLine(Vector<long,_2> *p,SubpixelLineSegment *l)

{
  Vector<long,_2> v;
  Vector<long,_2> u;
  long local_40;
  long local_38;
  long local_30;
  long local_28;
  
  SubpixelLineSegment::direction((SubpixelLineSegment *)&local_30);
  tcu::operator-(p,&l->m_v0);
  return SUB81((ulong)(local_38 * local_30 - local_40 * local_28) >> 0x3f,0);
}

Assistant:

static bool vertexOnLeftSideOfLine (const tcu::Vector<deInt64,2>& p, const SubpixelLineSegment& l)
{
	const tcu::Vector<deInt64,2> u = l.direction();
	const tcu::Vector<deInt64,2> v = ( p - l.m_v0);
	const deInt64 crossProduct = (u.x() * v.y() - u.y() * v.x());
	return crossProduct < 0;
}